

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::BeginTryTableExpr
          (ExprVisitorDelegate *this,TryTableExpr *expr)

{
  WatWriter *pWVar1;
  byte bVar2;
  bool bVar3;
  Index IVar4;
  char *s;
  reference pTVar5;
  TableCatch *catch_;
  iterator __end2;
  iterator __begin2;
  TryTableVector *__range2;
  bool has_label;
  TryTableExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  pWVar1 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::TryTable_Opcode);
  WritePutsSpace(pWVar1,s);
  bVar2 = std::__cxx11::string::empty();
  bVar2 = (bVar2 ^ 0xff) & 1;
  if (bVar2 != 0) {
    WriteString(this->writer_,&(expr->block).label,Space);
  }
  WriteTypes(this->writer_,&(expr->block).decl.sig.param_types,"param");
  WriteTypes(this->writer_,&(expr->block).decl.sig.result_types,"result");
  if (bVar2 == 0) {
    pWVar1 = this->writer_;
    IVar4 = ModuleContext::GetLabelStackSize(&this->writer_->super_ModuleContext);
    Writef(pWVar1," ;; label = @%u",(ulong)IVar4);
  }
  WriteNewline(this->writer_,true);
  Indent(this->writer_);
  __end2 = std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::begin(&expr->catches);
  catch_ = (TableCatch *)
           std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::end(&expr->catches);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
                                     *)&catch_), bVar3) {
    pTVar5 = __gnu_cxx::
             __normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
             ::operator*(&__end2);
    WritePuts(this->writer_,"(",None);
    switch(pTVar5->kind) {
    case Catch:
      WritePutsSpace(this->writer_,"catch");
      break;
    case CatchRef:
      WritePutsSpace(this->writer_,"catch_ref");
      break;
    case CatchAll:
      WritePutsSpace(this->writer_,"catch_all");
      break;
    case CatchAllRef:
      WritePutsSpace(this->writer_,"catch_all_ref");
    }
    if ((pTVar5->kind == Catch) || (pTVar5->kind == CatchRef)) {
      WriteVar(this->writer_,&pTVar5->tag,Space);
    }
    WriteBrVar(this->writer_,&pTVar5->target,None);
    WritePuts(this->writer_,")",Newline);
    __gnu_cxx::
    __normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
    ::operator++(&__end2);
  }
  ModuleContext::BeginBlock(&this->writer_->super_ModuleContext,TryTable,&expr->block);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::BeginTryTableExpr(TryTableExpr* expr) {
  // copied from WriteBeginBlock, try_table needs to push label *after*
  // writing catches
  writer_->WritePutsSpace(Opcode::TryTable_Opcode.GetName());
  bool has_label = !expr->block.label.empty();
  if (has_label) {
    writer_->WriteString(expr->block.label, NextChar::Space);
  }
  writer_->WriteTypes(expr->block.decl.sig.param_types, "param");
  writer_->WriteTypes(expr->block.decl.sig.result_types, "result");
  if (!has_label) {
    writer_->Writef(" ;; label = @%" PRIindex, writer_->GetLabelStackSize());
  }
  writer_->WriteNewline(FORCE_NEWLINE);
  writer_->Indent();
  for (const auto& catch_ : expr->catches) {
    writer_->WritePuts("(", NextChar::None);
    switch (catch_.kind) {
      case CatchKind::Catch:
        writer_->WritePutsSpace("catch");
        break;
      case CatchKind::CatchRef:
        writer_->WritePutsSpace("catch_ref");
        break;
      case CatchKind::CatchAll:
        writer_->WritePutsSpace("catch_all");
        break;
      case CatchKind::CatchAllRef:
        writer_->WritePutsSpace("catch_all_ref");
        break;
    }
    if (catch_.kind == CatchKind::Catch || catch_.kind == CatchKind::CatchRef) {
      writer_->WriteVar(catch_.tag, NextChar::Space);
    }
    writer_->WriteBrVar(catch_.target, NextChar::None);
    writer_->WritePuts(")", NextChar::Newline);
  }
  writer_->BeginBlock(LabelType::TryTable, expr->block);
  return Result::Ok;
}